

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

string * __thiscall
t_ocaml_generator::type_to_enum_abi_cxx11_
          (string *__return_storage_ptr__,t_ocaml_generator *this,t_type *type)

{
  uint uVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [16];
  allocator local_25;
  t_base local_24;
  t_base_type *ptStack_20;
  t_base tbase;
  t_type *type_local;
  t_ocaml_generator *this_local;
  
  ptStack_20 = (t_base_type *)type;
  type_local = (t_type *)this;
  this_local = (t_ocaml_generator *)__return_storage_ptr__;
  ptStack_20 = (t_base_type *)t_generator::get_true_type(type);
  uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[10])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xb])();
      if (((uVar1 & 1) == 0) &&
         (uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar1 & 1) == 0)) {
        uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0x10])();
        if ((uVar1 & 1) == 0) {
          uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xf])();
          if ((uVar1 & 1) == 0) {
            uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[0xe])();
            if ((uVar1 & 1) == 0) goto switchD_003dcd81_default;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"Protocol.T_LIST",&local_40);
            std::allocator<char>::~allocator((allocator<char> *)&local_40);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"Protocol.T_SET",&local_3f);
            std::allocator<char>::~allocator((allocator<char> *)&local_3f);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"Protocol.T_MAP",&local_3e);
          std::allocator<char>::~allocator((allocator<char> *)&local_3e);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"Protocol.T_STRUCT",&local_3d)
        ;
        std::allocator<char>::~allocator((allocator<char> *)&local_3d);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Protocol.T_I32",&local_3c);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    }
  }
  else {
    local_24 = t_base_type::get_base(ptStack_20);
    switch(local_24) {
    case TYPE_VOID:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Protocol.T_VOID",&local_25);
      std::allocator<char>::~allocator((allocator<char> *)&local_25);
      break;
    case TYPE_STRING:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Protocol.T_STRING",local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
      break;
    case TYPE_BOOL:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Protocol.T_BOOL",&local_36);
      std::allocator<char>::~allocator((allocator<char> *)&local_36);
      break;
    case TYPE_I8:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Protocol.T_BYTE",&local_37);
      std::allocator<char>::~allocator((allocator<char> *)&local_37);
      break;
    case TYPE_I16:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Protocol.T_I16",&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_38);
      break;
    case TYPE_I32:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Protocol.T_I32",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      break;
    case TYPE_I64:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Protocol.T_I64",&local_3a);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a);
      break;
    case TYPE_DOUBLE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Protocol.T_DOUBLE",&local_3b);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b);
      break;
    default:
switchD_003dcd81_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar2 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar2));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_ocaml_generator::type_to_enum(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      return "Protocol.T_VOID";
    case t_base_type::TYPE_STRING:
      return "Protocol.T_STRING";
    case t_base_type::TYPE_BOOL:
      return "Protocol.T_BOOL";
    case t_base_type::TYPE_I8:
      return "Protocol.T_BYTE";
    case t_base_type::TYPE_I16:
      return "Protocol.T_I16";
    case t_base_type::TYPE_I32:
      return "Protocol.T_I32";
    case t_base_type::TYPE_I64:
      return "Protocol.T_I64";
    case t_base_type::TYPE_DOUBLE:
      return "Protocol.T_DOUBLE";
    }
  } else if (type->is_enum()) {
    return "Protocol.T_I32";
  } else if (type->is_struct() || type->is_xception()) {
    return "Protocol.T_STRUCT";
  } else if (type->is_map()) {
    return "Protocol.T_MAP";
  } else if (type->is_set()) {
    return "Protocol.T_SET";
  } else if (type->is_list()) {
    return "Protocol.T_LIST";
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}